

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.cpp
# Opt level: O0

void __thiscall mpt::slice::slice(slice *this,slice *from)

{
  content *pcVar1;
  slice *from_local;
  slice *this_local;
  
  array::array(&this->super_array,&from->super_array);
  this->_off = 0;
  this->_len = 0;
  reference<mpt::array::content>::operator=
            ((reference<mpt::array::content> *)this,(reference<mpt::array::content> *)from);
  pcVar1 = reference<mpt::array::content>::instance((reference<mpt::array::content> *)this);
  if (pcVar1 != (content *)0x0) {
    this->_len = from->_len;
    this->_off = from->_off;
  }
  return;
}

Assistant:

slice::slice(slice const& from) : array(from), _off(0), _len(0)
{
	_buf = from._buf;
	if (!_buf.instance()) {
		return;
	}
	_len = from._len;
	_off = from._off;
}